

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *makefile,
          string *tgt)

{
  cmOutputConverter *this_00;
  cmGlobalGenerator *pcVar1;
  string_view source;
  string_view str;
  string_view str_00;
  char local_b1;
  string tgt2;
  cmAlphaNum local_80;
  string local_50;
  
  tgt2._M_dataplus._M_p = (pointer)0x19;
  tgt2._M_string_length = (size_type)anon_var_dwarf_17b3de6;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  source._M_str = (makefile->_M_dataplus)._M_p;
  source._M_len = makefile->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_50,this_00,source,SHELL);
  local_80.View_._M_len = local_50._M_string_length;
  local_80.View_._M_str = local_50._M_dataplus._M_p;
  local_b1 = ' ';
  cmStrCat<char>(__return_storage_ptr__,(cmAlphaNum *)&tgt2,&local_80,&local_b1);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  if ((pcVar1->MakeSilentFlag)._M_string_length != 0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (*(char *)((long)&pcVar1[1].FindMakeProgramFile._M_string_length + 1) == '\x01') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (tgt->_M_string_length != 0) {
    cmOutputConverter::MaybeRelativeToTopBinDir(&tgt2,this_00,tgt);
    cmSystemTools::ConvertToOutputSlashes(&tgt2);
    if (this->MakeCommandEscapeTargetTwice == true) {
      str._M_str = tgt2._M_dataplus._M_p;
      str._M_len = tgt2._M_string_length;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                ((string *)&local_80,this_00,str,true,false,false,false,false);
      std::__cxx11::string::operator=((string *)&tgt2,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    str_00._M_str = tgt2._M_dataplus._M_p;
    str_00._M_len = tgt2._M_string_length;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              ((string *)&local_80,this_00,str_00,true,false,false,false,false);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&tgt2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall(
  const std::string& makefile, const std::string& tgt)
{
  // Call make on the given file.
  std::string cmd = cmStrCat(
    "$(MAKE) $(MAKESILENT) -f ",
    this->ConvertToOutputFormat(makefile, cmOutputConverter::SHELL), ' ');

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  // Pass down verbosity level.
  if (!gg->MakeSilentFlag.empty()) {
    cmd += gg->MakeSilentFlag;
    cmd += " ";
  }

  // Most unix makes will pass the command line flags to make down to
  // sub-invoked makes via an environment variable.  However, some
  // makes do not support that, so you have to pass the flags
  // explicitly.
  if (gg->PassMakeflags) {
    cmd += "-$(MAKEFLAGS) ";
  }

  // Add the target.
  if (!tgt.empty()) {
    // The make target is always relative to the top of the build tree.
    std::string tgt2 = this->MaybeRelativeToTopBinDir(tgt);

    // The target may have been written with windows paths.
    cmSystemTools::ConvertToOutputSlashes(tgt2);

    // Escape one extra time if the make tool requires it.
    if (this->MakeCommandEscapeTargetTwice) {
      tgt2 = this->EscapeForShell(tgt2, true, false);
    }

    // The target name is now a string that should be passed verbatim
    // on the command line.
    cmd += this->EscapeForShell(tgt2, true, false);
  }
  return cmd;
}